

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MineFusing.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::MineFusing::MineFusing
          (MineFusing *this,MineFuse Primary,MineFuse Secondary,KBOOL AntiHandlingDevice)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__MineFusing_00217e40;
  (this->m_FuseUnion).m_ui16Fusing =
       (ushort)AntiHandlingDevice << 0xe | (ushort)Primary & 0x7f |
       (ushort)((Secondary & 0x7f) << 7);
  return;
}

Assistant:

MineFusing::MineFusing( MineFuse Primary, MineFuse Secondary, KBOOL AntiHandlingDevice )
{
    m_FuseUnion.m_ui16Fusing = 0;
    m_FuseUnion.m_ui16Primary = Primary;
    m_FuseUnion.m_ui16Secondary = Secondary;
    m_FuseUnion.m_ui16AHD = AntiHandlingDevice;
}